

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRle.cpp
# Opt level: O1

int Imf_2_5::rleUncompress(int inLength,int maxLength,char *in,char *out)

{
  char *__dest;
  int iVar1;
  ulong __n;
  int local_38;
  
  __dest = out;
  if (0 < inLength) {
    do {
      iVar1 = (int)*in;
      if (*in < '\0') {
        inLength = (inLength + iVar1) - 1;
        maxLength = maxLength + iVar1;
        if ((maxLength | inLength) < 0) {
          return 0;
        }
        __n = (ulong)(uint)-iVar1;
        memcpy(__dest,in + 1,__n);
        in = in + 1 + __n;
      }
      else {
        maxLength = maxLength - (iVar1 + 1U);
        if (maxLength < 0) {
          return 0;
        }
        __n = (ulong)(iVar1 + 1U);
        memset(__dest,(uint)(byte)in[1],__n);
        in = in + 2;
        inLength = inLength - 2;
      }
      __dest = __dest + __n;
    } while (0 < inLength);
  }
  local_38 = (int)out;
  return (int)__dest - local_38;
}

Assistant:

int
rleUncompress (int inLength, int maxLength, const signed char in[], char out[])
{
    char *outStart = out;

    while (inLength > 0)
    {
	if (*in < 0)
	{
	    int count = -((int)*in++);
	    inLength -= count + 1;

	    if (0 > (maxLength -= count))
		return 0;

        // check the input buffer is big enough to contain
        // 'count' bytes of remaining data
        if (inLength < 0)
          return 0;

        memcpy(out, in, count);
        out += count;
        in  += count;
	}
	else
	{
	    int count = *in++;
	    inLength -= 2;

	    if (0 > (maxLength -= count + 1))
		return 0;

        memset(out, *(char*)in, count+1);
        out += count+1;

	    in++;
	}
    }

    return out - outStart;
}